

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice_plane.cpp
# Opt level: O0

void __thiscall polyscope::SlicePlane::setSliceGeomUniforms(SlicePlane *this,ShaderProgram *p)

{
  undefined1 auVar1 [16];
  long *plVar2;
  long *in_RSI;
  float fVar3;
  undefined8 extraout_XMM0_Qb;
  undefined8 uVar5;
  undefined1 in_ZMM0 [64];
  undefined1 auVar6 [56];
  undefined1 auVar4 [64];
  vec3 vVar7;
  vec3 norm;
  vec<3,_float,_(glm::qualifier)0> *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  SlicePlane *in_stack_ffffffffffffff10;
  SlicePlane *in_stack_ffffffffffffff50;
  allocator local_a1;
  string local_a0 [32];
  undefined8 local_80;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_78;
  undefined8 local_70;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_68;
  allocator local_51;
  string local_50 [32];
  undefined8 local_30;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_28;
  undefined8 local_20;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_18;
  long *local_10;
  
  auVar6 = in_ZMM0._8_56_;
  local_10 = in_RSI;
  vVar7 = getNormal(in_stack_ffffffffffffff50);
  plVar2 = local_10;
  local_28 = vVar7.field_2;
  auVar4._0_8_ = vVar7._0_8_;
  auVar4._8_56_ = auVar6;
  local_30 = vmovlpd_avx(auVar4._0_16_);
  local_20 = local_30;
  local_18 = local_28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"u_sliceVector",&local_51);
  local_68.z = local_18.z;
  local_70 = local_20;
  local_78.z = local_18.z;
  local_80 = local_20;
  (**(code **)(*plVar2 + 0x48))(local_20,local_18.z,plVar2,local_50);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,"u_slicePoint",&local_a1);
  uVar5 = extraout_XMM0_Qb;
  vVar7 = getCenter(in_stack_ffffffffffffff10);
  auVar1._8_8_ = uVar5;
  auVar1._0_8_ = vVar7._0_8_;
  vmovlpd_avx(auVar1);
  fVar3 = glm::dot<3,float,(glm::qualifier)0>
                    ((vec<3,_float,_(glm::qualifier)0> *)
                     CONCAT44(vVar7.field_2,in_stack_ffffffffffffff00),in_stack_fffffffffffffef8);
  (**(code **)(*local_10 + 0x28))(fVar3,local_10,local_a0);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  return;
}

Assistant:

void SlicePlane::setSliceGeomUniforms(render::ShaderProgram& p) {
  glm::vec3 norm = getNormal();
  p.setUniform("u_sliceVector", norm);
  p.setUniform("u_slicePoint", glm::dot(getCenter(), norm));
}